

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

int memory_tree_ns::random_sample_example_pop(memory_tree *b,uint32_t *cn)

{
  double dVar1;
  uint *puVar2;
  uint32_t *puVar3;
  node *pnVar4;
  ostream *poVar5;
  uint32_t index;
  uint uVar6;
  ulong uVar7;
  v_array<unsigned_int> *array;
  float fVar8;
  
  *cn = 0;
  pnVar4 = (b->nodes)._begin;
  if (pnVar4->internal == 1) {
    uVar7 = 0;
    do {
      if (1.0 <= pnVar4->nl) {
        if (1.0 <= pnVar4->nr) {
          if ((pnVar4->nl < 1.0) || (pnVar4->nr < 1.0)) {
            poVar5 = (ostream *)std::ostream::operator<<(&std::cout,(uint)uVar7);
            poVar5 = std::operator<<(poVar5," ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(b->nodes)._begin[*cn].nl);
            poVar5 = std::operator<<(poVar5," ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(b->nodes)._begin[*cn].nr);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::operator<<((ostream *)&std::cout,"Error:  nl = 0, and nr = 0, exit...");
            exit(0);
          }
          fVar8 = merand48(&b->all->random_state);
          pnVar4 = (b->nodes)._begin;
          dVar1 = pnVar4[*cn].nl;
          if (dVar1 / (pnVar4[*cn].nr + dVar1) <= (double)fVar8) goto LAB_0021d530;
        }
        pnVar4 = (b->nodes)._begin;
        pnVar4[*cn].nl = pnVar4[*cn].nl + -1.0;
        puVar3 = &(b->nodes)._begin[*cn].left;
      }
      else {
LAB_0021d530:
        pnVar4 = (b->nodes)._begin;
        pnVar4[*cn].nr = pnVar4[*cn].nr + -1.0;
        puVar3 = &(b->nodes)._begin[*cn].right;
      }
      uVar7 = (ulong)*puVar3;
      *cn = *puVar3;
      pnVar4 = (b->nodes)._begin + uVar7;
    } while (pnVar4->internal == 1);
  }
  if ((pnVar4->examples_index)._end == (pnVar4->examples_index)._begin) {
    uVar6 = 0xffffffff;
  }
  else {
    fVar8 = merand48(&b->all->random_state);
    pnVar4 = (b->nodes)._begin;
    array = &pnVar4[*cn].examples_index;
    puVar2 = array->_begin;
    index = (uint32_t)
            (fVar8 * (float)(ulong)((long)pnVar4[*cn].examples_index._end - (long)puVar2 >> 2));
    uVar6 = puVar2[(int)index];
    remove_at_index<unsigned_int>(array,index);
  }
  return uVar6;
}

Assistant:

inline int random_sample_example_pop(memory_tree& b, uint32_t& cn)
    {
        cn = 0; //always start from the root:
        while (b.nodes[cn].internal == 1)
        {
            float pred = 0.;   //deal with some edge cases:
            if (b.nodes[cn].nl < 1) //no examples routed to left ever:
                pred = 1.f; //go right.
            else if (b.nodes[cn].nr < 1) //no examples routed to right ever:
                pred = -1.f; //go left.
            else if ((b.nodes[cn].nl >= 1) && (b.nodes[cn].nr >= 1))
                pred = merand48(b.all->random_state) < (b.nodes[cn].nl*1./(b.nodes[cn].nr+b.nodes[cn].nl)) ? -1.f : 1.f;
            else{
                cout<<cn<<" "<<b.nodes[cn].nl<<" "<<b.nodes[cn].nr<<endl;
                cout<<"Error:  nl = 0, and nr = 0, exit...";
                exit(0);
            }
            
            if (pred < 0){
                b.nodes[cn].nl--;
                cn = b.nodes[cn].left; 
            }
            else{
                b.nodes[cn].nr--;
                cn = b.nodes[cn].right;
            }
        }

        if (b.nodes[cn].examples_index.size() >= 1){
            int loc_at_leaf = int(merand48(b.all->random_state)*b.nodes[cn].examples_index.size());
	        uint32_t ec_id = b.nodes[cn].examples_index[loc_at_leaf];
            remove_at_index(b.nodes[cn].examples_index, loc_at_leaf); 
            return ec_id;
        }
        else    
            return -1;
    }